

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O3

void cppurses::detail::Screen::delegate_paint(Widget *widg,Screen_descriptor *staged_tiles)

{
  bool bVar1;
  wchar_t wVar2;
  long lVar3;
  byte local_33 [3];
  Glyph local_30;
  
  Widget::generate_wallpaper(&local_30,widg);
  if ((widg->screen_state_).optimize.just_enabled == false) {
    wVar2 = (widg->screen_state_).optimize.wallpaper.symbol;
    if (local_30.symbol == wVar2) {
      bVar1 = operator==(&local_30.brush,&(widg->screen_state_).optimize.wallpaper.brush);
      if (!bVar1) {
        wVar2 = (widg->screen_state_).optimize.wallpaper.symbol;
        goto LAB_0014f94c;
      }
      goto LAB_0014f89e;
    }
LAB_0014f94c:
    if ((local_30.symbol == L' ') && (wVar2 == L' ')) {
      local_33[0] = 2;
      local_33[1] = 3;
      local_33[2] = 5;
      lVar3 = 0;
      do {
        if ((((widg->screen_state_).optimize.wallpaper.brush.attributes_.super__Base_bitset<1UL>.
              _M_w >> (local_33[lVar3] & 0x3f) & 1) != 0) ==
            (((ulong)local_30.brush.attributes_.super__Base_bitset<1UL>._M_w >>
              (local_33[lVar3] & 0x3f) & 1) != 0)) goto LAB_0014f824;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      bVar1 = (widg->screen_state_).optimize.wallpaper.brush.background_color_.initialized_;
      if (local_30.brush.background_color_.initialized_ == false) {
        if (bVar1 == false) goto LAB_0014f89e;
      }
      else if ((bVar1 != false) &&
              (*&(widg->screen_state_).optimize.wallpaper.brush.background_color_.storage_.data_ ==
               local_30.brush.background_color_.storage_.data_)) {
LAB_0014f89e:
        if (((widg->screen_state_).optimize.moved != true) &&
           ((widg->screen_state_).optimize.resized == false)) {
          if ((widg->screen_state_).optimize.child_event == true) {
            paint_empty_tiles(widg);
          }
          basic_paint(widg,staged_tiles);
          goto LAB_0014f82f;
        }
      }
    }
  }
LAB_0014f824:
  full_paint(widg,staged_tiles);
LAB_0014f82f:
  Screen_state::Optimize::reset(&(widg->screen_state_).optimize);
  (widg->screen_state_).optimize.wallpaper.symbol = local_30.symbol;
  (widg->screen_state_).optimize.wallpaper.brush.attributes_.super__Base_bitset<1UL>._M_w =
       (_WordT)local_30.brush.attributes_.super__Base_bitset<1UL>._M_w;
  if ((widg->screen_state_).optimize.wallpaper.brush.background_color_.initialized_ == true) {
    if (local_30.brush.background_color_.initialized_ == false) {
      (widg->screen_state_).optimize.wallpaper.brush.background_color_.initialized_ = false;
    }
    else {
      *&(widg->screen_state_).optimize.wallpaper.brush.background_color_.storage_.data_ =
           local_30.brush.background_color_.storage_.data_;
    }
  }
  else if (local_30.brush.background_color_.initialized_ != false) {
    *&(widg->screen_state_).optimize.wallpaper.brush.background_color_.storage_.data_ =
         local_30.brush.background_color_.storage_.data_;
    (widg->screen_state_).optimize.wallpaper.brush.background_color_.initialized_ = true;
  }
  if ((widg->screen_state_).optimize.wallpaper.brush.foreground_color_.initialized_ == true) {
    if (local_30.brush.foreground_color_.initialized_ == false) {
      (widg->screen_state_).optimize.wallpaper.brush.foreground_color_.initialized_ = false;
    }
    else {
      *&(widg->screen_state_).optimize.wallpaper.brush.foreground_color_.storage_.data_ =
           local_30.brush.foreground_color_.storage_.data_;
    }
  }
  else if (local_30.brush.foreground_color_.initialized_ != false) {
    *&(widg->screen_state_).optimize.wallpaper.brush.foreground_color_.storage_.data_ =
         local_30.brush.foreground_color_.storage_.data_;
    (widg->screen_state_).optimize.wallpaper.brush.foreground_color_.initialized_ = true;
  }
  return;
}

Assistant:

void Screen::delegate_paint(Widget& widg, const Screen_descriptor& staged_tiles)
{
    auto& optimization_info       = widg.screen_state().optimize;
    auto& previous_wallpaper      = optimization_info.wallpaper;
    const auto& current_wallpaper = widg.generate_wallpaper();
    if (optimization_info.just_enabled) {
        paint_just_enabled(widg, staged_tiles);
    }
    else if (!has_same_display(current_wallpaper, previous_wallpaper)) {
        full_paint(widg, staged_tiles);
    }
    else if (optimization_info.moved) {
        paint_move_event(widg, staged_tiles);
    }
    else if (optimization_info.resized) {
        // paint_resize_event(widg, staged_tiles);
        full_paint(widg, staged_tiles);
    }
    else if (optimization_info.child_event) {
        paint_child_event(widg, staged_tiles);
    }
    else {
        basic_paint(widg, staged_tiles);
    }
    optimization_info.reset();
    previous_wallpaper = current_wallpaper;
}